

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.cpp
# Opt level: O2

void __thiscall adios2::IO::SetEngine(IO *this,string *engineType)

{
  IO *pIVar1;
  allocator local_61;
  string local_60;
  string local_40 [32];
  
  pIVar1 = this->m_IO;
  std::__cxx11::string::string((string *)&local_60,"in call to IO::SetEngine",&local_61);
  helper::CheckForNullptr<adios2::core::IO>(pIVar1,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  pIVar1 = this->m_IO;
  std::__cxx11::string::string(local_40,(string *)engineType);
  adios2::core::IO::SetEngine(pIVar1,local_40);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void IO::SetEngine(const std::string engineType)
{
    helper::CheckForNullptr(m_IO, "in call to IO::SetEngine");
    m_IO->SetEngine(engineType);
}